

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O1

fvar<float,_2UL> __thiscall
ising::free_energy::triangular::anon_unknown_4::
functor<float,_boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>_>::operator()
          (functor<float,_boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>_>
           *this,float t1,float t2)

{
  undefined1 auVar1 [12];
  float fVar2;
  size_t i;
  long lVar3;
  float fVar4;
  float fVar5;
  array<float,_3UL> aVar6;
  fvar<float,_2UL> retval;
  array<float,_3UL> local_88;
  float local_78;
  float local_74;
  float local_70 [4];
  float local_60 [4];
  float local_50 [4];
  float local_40 [4];
  float local_30 [4];
  fvar<float,_2UL> local_20;
  
  local_78 = t2;
  local_74 = t1;
  fVar4 = cosf(t1);
  auVar1 = *(undefined1 (*) [12])(this->sh2a_).v._M_elems;
  local_88._M_elems[0] = (float)*(undefined8 *)(this->sh2a_).v._M_elems;
  local_88._M_elems[0] = local_88._M_elems[0] * fVar4;
  local_88._M_elems._4_8_ = auVar1._4_8_;
  aVar6._M_elems = local_88._M_elems;
  fVar5 = auVar1._4_4_;
  local_88._M_elems[2] = auVar1._8_4_;
  fVar2 = local_88._M_elems[2];
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    local_88._M_elems[1] = fVar4 * fVar5;
    aVar6._M_elems = local_88._M_elems;
  }
  local_88._M_elems = aVar6._M_elems;
  if (fVar2 != 0.0) {
    local_88._M_elems[2] = fVar4 * fVar2;
  }
  aVar6._M_elems = local_88._M_elems;
  local_50[0] = local_88._M_elems[0];
  local_50[1] = local_88._M_elems[1];
  local_50[2] = local_88._M_elems[2];
  lVar3 = 0;
  local_88._M_elems = aVar6._M_elems;
  do {
    local_88._M_elems[lVar3] = (this->cshabc_).v._M_elems[lVar3] - local_50[lVar3];
    aVar6._M_elems = local_88._M_elems;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_40[0] = local_88._M_elems[0];
  local_40[1] = local_88._M_elems[1];
  local_40[2] = local_88._M_elems[2];
  local_88._M_elems = aVar6._M_elems;
  fVar4 = cosf(local_78);
  auVar1 = *(undefined1 (*) [12])(this->sh2b_).v._M_elems;
  local_88._M_elems[0] = (float)*(undefined8 *)(this->sh2b_).v._M_elems;
  local_88._M_elems[0] = local_88._M_elems[0] * fVar4;
  local_88._M_elems._4_8_ = auVar1._4_8_;
  aVar6._M_elems = local_88._M_elems;
  fVar5 = auVar1._4_4_;
  local_88._M_elems[2] = auVar1._8_4_;
  fVar2 = local_88._M_elems[2];
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    local_88._M_elems[1] = fVar4 * fVar5;
    aVar6._M_elems = local_88._M_elems;
  }
  local_88._M_elems = aVar6._M_elems;
  if (fVar2 != 0.0) {
    local_88._M_elems[2] = fVar4 * fVar2;
  }
  aVar6._M_elems = local_88._M_elems;
  local_60[0] = local_88._M_elems[0];
  local_60[1] = local_88._M_elems[1];
  local_60[2] = local_88._M_elems[2];
  lVar3 = 0;
  local_88._M_elems = aVar6._M_elems;
  do {
    local_88._M_elems[lVar3] = local_40[lVar3] - local_60[lVar3];
    aVar6._M_elems = local_88._M_elems;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_30[0] = local_88._M_elems[0];
  local_30[1] = local_88._M_elems[1];
  local_30[2] = local_88._M_elems[2];
  local_88._M_elems = aVar6._M_elems;
  fVar4 = cosf(local_74 + local_78);
  auVar1 = *(undefined1 (*) [12])(this->sh2c_).v._M_elems;
  local_88._M_elems[0] = (float)*(undefined8 *)(this->sh2c_).v._M_elems;
  local_88._M_elems[0] = local_88._M_elems[0] * fVar4;
  local_88._M_elems._4_8_ = auVar1._4_8_;
  aVar6._M_elems = local_88._M_elems;
  fVar5 = auVar1._4_4_;
  local_88._M_elems[2] = auVar1._8_4_;
  fVar2 = local_88._M_elems[2];
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    local_88._M_elems[1] = fVar4 * fVar5;
    aVar6._M_elems = local_88._M_elems;
  }
  local_88._M_elems = aVar6._M_elems;
  if (fVar2 != 0.0) {
    local_88._M_elems[2] = fVar4 * fVar2;
  }
  aVar6._M_elems = local_88._M_elems;
  local_70[0] = local_88._M_elems[0];
  local_70[1] = local_88._M_elems[1];
  local_70[2] = local_88._M_elems[2];
  lVar3 = 0;
  local_88._M_elems = aVar6._M_elems;
  do {
    local_88._M_elems[lVar3] = local_30[lVar3] - local_70[lVar3];
    aVar6._M_elems = local_88._M_elems;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_20.v._M_elems[0] = local_88._M_elems[0];
  local_20.v._M_elems[1] = local_88._M_elems[1];
  local_20.v._M_elems[2] = local_88._M_elems[2];
  local_88._M_elems = aVar6._M_elems;
  local_88._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::log<float,2ul>(&local_20);
  aVar6._M_elems =
       (_Type)boost::math::differentiation::autodiff_v1::detail::fvar<float,_2UL>::operator*
                        ((fvar<float,_2UL> *)&local_88,&this->c_);
  return (array<float,_3UL>)(array<float,_3UL>)aVar6._M_elems;
}

Assistant:

FVAR operator()(T t1, T t2) const {
    using std::cos;
    using std::log;
    return c_ * log(cshabc_ - sh2a_ * cos(t1) - sh2b_ * cos(t2) -
                    sh2c_ * cos(t1 + t2));
  }